

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

void Js::PropertyValueInfo::ClearCacheInfo(PropertyValueInfo *info)

{
  if (info != (PropertyValueInfo *)0x0) {
    info->functionBody = (FunctionBody *)0x0;
    info->prop = (RecyclableObject *)0x0;
    info->inlineCache = (InlineCache *)0x0;
    info->polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info->propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    info->inlineCacheIndex = 0xffffffff;
    info->allowResizingPolymorphicInlineCache = true;
  }
  return;
}

Assistant:

void PropertyValueInfo::ClearCacheInfo(PropertyValueInfo* info)
    {
        if (info != NULL)
        {
            info->functionBody = nullptr;
            info->inlineCache = nullptr;
            info->polymorphicInlineCache = nullptr;
            info->prop = nullptr;
            info->propertyRecordUsageCache = nullptr;
            info->inlineCacheIndex = Constants::NoInlineCacheIndex;
            info->allowResizingPolymorphicInlineCache = true;
        }
    }